

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemFrontend.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_17d44::BuildSystemFrontendExecutionQueueDelegate::processStarted
          (BuildSystemFrontendExecutionQueueDelegate *this,ProcessContext *command,
          ProcessHandle handle,llbuild_pid_t pid)

{
  BuildSystem *this_00;
  BuildSystemDelegate *pBVar1;
  llbuild_pid_t pid_local;
  ProcessContext *command_local;
  BuildSystemFrontendExecutionQueueDelegate *this_local;
  ProcessHandle handle_local;
  
  this_00 = getSystem(this);
  pBVar1 = llbuild::buildsystem::BuildSystem::getDelegate(this_00);
  (*pBVar1->_vptr_BuildSystemDelegate[0x17])(pBVar1,command,handle.id);
  return;
}

Assistant:

virtual void processStarted(ProcessContext* command,
                              ProcessHandle handle,
                              llbuild_pid_t pid) override {
    static_cast<BuildSystemFrontendDelegate*>(&getSystem().getDelegate())->
      commandProcessStarted(
          reinterpret_cast<Command*>(command),
          BuildSystemFrontendDelegate::ProcessHandle { handle.id });
  }